

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

void __thiscall r_code::Atom::trace(Atom *this)

{
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  char *pcVar4;
  ostream *poVar5;
  char cVar6;
  bool bVar7;
  float fVar8;
  char *local_1a0;
  byte local_39;
  uint8_t i;
  char *content;
  string s;
  Atom *this_local;
  
  write_indents(this);
  uVar1 = getDescriptor(this);
  switch(uVar1) {
  case 0x80:
    std::operator<<((ostream *)&std::cout,"nil");
    break;
  case 0x81:
    poVar5 = std::operator<<((ostream *)&std::cout,"bl: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::boolalpha);
    bVar7 = asBoolean(this);
    std::ostream::operator<<(poVar5,bVar7);
    break;
  case 0x82:
    std::operator<<((ostream *)&std::cout,":");
    break;
  case 0x83:
    std::operator<<((ostream *)&std::cout,"::");
    break;
  case 0x84:
    poVar5 = std::operator<<((ostream *)&std::cout,"iptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x85:
    poVar5 = std::operator<<((ostream *)&std::cout,"rptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x86:
    poVar5 = std::operator<<((ostream *)&std::cout,"vlptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x87:
    poVar5 = std::operator<<((ostream *)&std::cout,"ipgm_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x88:
    poVar5 = std::operator<<((ostream *)&std::cout,"in_obj_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = asInputIndex(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
    poVar5 = std::operator<<(poVar5," ");
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x89:
    poVar5 = std::operator<<((ostream *)&std::cout,"value_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x8a:
    poVar5 = std::operator<<((ostream *)&std::cout,"prod_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x8b:
    poVar5 = std::operator<<((ostream *)&std::cout,"out_obj_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x8c:
    poVar5 = std::operator<<((ostream *)&std::cout,"d_in_obj_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = asRelativeIndex(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
    poVar5 = std::operator<<(poVar5," ");
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0x8d:
    poVar5 = std::operator<<((ostream *)&std::cout,"assign_ptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = asAssignmentIndex(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)bVar2);
    poVar5 = std::operator<<(poVar5," ");
    uVar3 = asIndex(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  default:
    if (Timestamp_data == '\0') {
      if (String_data == '\0') {
        bVar7 = isFloat(this);
        if (bVar7) {
          poVar5 = std::operator<<((ostream *)&std::cout,"nb: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
          fVar8 = asFloat(this);
          std::ostream::operator<<(poVar5,fVar8);
        }
        else {
          std::operator<<((ostream *)&std::cout,"undef");
        }
      }
      else {
        String_data = String_data + 0xff;
        std::__cxx11::string::string((string *)&content);
        local_39 = 0;
        while ((local_39 < 4 &&
               (cVar6 = Char_count + -1, bVar7 = Char_count != '\0', Char_count = cVar6, bVar7))) {
          std::__cxx11::string::operator+=
                    ((string *)&content,*(char *)((long)&this->atom + (ulong)local_39));
          local_39 = local_39 + 1;
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::operator<<((ostream *)&std::cout,pcVar4);
        std::__cxx11::string::~string((string *)&content);
      }
    }
    else {
      Timestamp_data = Timestamp_data + -1;
      std::ostream::operator<<((ostream *)&std::cout,this->atom);
    }
    break;
  case 0x90:
    std::operator<<((ostream *)&std::cout,"this");
    break;
  case 0x91:
    std::operator<<((ostream *)&std::cout,"view");
    break;
  case 0x92:
    std::operator<<((ostream *)&std::cout,"mks");
    break;
  case 0x93:
    std::operator<<((ostream *)&std::cout,"vws");
    break;
  case 0xa0:
    poVar5 = std::operator<<((ostream *)&std::cout,"nid: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = getNodeID(this);
    std::ostream::operator<<(poVar5,(uint)bVar2);
    break;
  case 0xa1:
    poVar5 = std::operator<<((ostream *)&std::cout,"did: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = getNodeID(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getClassID(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getDeviceID(this);
    std::ostream::operator<<(poVar5,(uint)bVar2);
    break;
  case 0xa2:
    poVar5 = std::operator<<((ostream *)&std::cout,"fid: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    std::ostream::operator<<(poVar5,uVar3);
    break;
  case 0xc0:
    poVar5 = std::operator<<((ostream *)&std::cout,"cptr: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc1:
    poVar5 = std::operator<<((ostream *)&std::cout,"set: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc2:
    poVar5 = std::operator<<((ostream *)&std::cout,"s_set: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc3:
    poVar5 = std::operator<<((ostream *)&std::cout,"obj: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc4:
    poVar5 = std::operator<<((ostream *)&std::cout,"mk: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc5:
    poVar5 = std::operator<<((ostream *)&std::cout,"op: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc6:
    poVar5 = std::operator<<((ostream *)&std::cout,"st: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    Char_count = (char)this->atom;
    String_data = Members_to_go;
    break;
  case 199:
    std::operator<<((ostream *)&std::cout,"us");
    Timestamp_data = '\x02';
    Members_to_go = '\x02';
    break;
  case 200:
    poVar5 = std::operator<<((ostream *)&std::cout,"grp: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xc9:
  case 0xcb:
  case 0xcc:
    poVar5 = std::operator<<((ostream *)&std::cout,"ipgm: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xcd:
    poVar5 = std::operator<<((ostream *)&std::cout,"cst: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xce:
    poVar5 = std::operator<<((ostream *)&std::cout,"mdl: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
    uVar3 = asOpcode(this);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," ");
    bVar2 = getAtomCount(this);
    std::ostream::operator<<(poVar5,(ushort)bVar2);
    Members_to_go = getAtomCount(this);
    break;
  case 0xcf:
    poVar5 = std::operator<<((ostream *)&std::cout,"null pgm ");
    bVar7 = takesPastInputs(this);
    if (bVar7) {
      local_1a0 = "all inputs";
    }
    else {
      local_1a0 = "new inputs";
    }
    std::operator<<(poVar5,local_1a0);
  }
  return;
}

Assistant:

void Atom::trace() const
{
    write_indents();

    switch (getDescriptor()) {
    case NIL:
        std::cout << "nil";
        return;

    case BOOLEAN_:
        std::cout << "bl: " << std::boolalpha << asBoolean();
        return;

    case WILDCARD:
        std::cout << ":";
        return;

    case T_WILDCARD:
        std::cout << "::";
        return;

    case I_PTR:
        std::cout << "iptr: " << std::dec << asIndex();
        return;

    case VL_PTR:
        std::cout << "vlptr: " << std::dec << asIndex();
        return;

    case R_PTR:
        std::cout << "rptr: " << std::dec << asIndex();
        return;

    case IPGM_PTR:
        std::cout << "ipgm_ptr: " << std::dec << asIndex();
        return;

    case IN_OBJ_PTR:
        std::cout << "in_obj_ptr: " << std::dec << (uint32_t)asInputIndex() << " " << asIndex();
        return;

    case D_IN_OBJ_PTR:
        std::cout << "d_in_obj_ptr: " << std::dec << (uint32_t)asRelativeIndex() << " " << asIndex();
        return;

    case OUT_OBJ_PTR:
        std::cout << "out_obj_ptr: " << std::dec << asIndex();
        return;

    case VALUE_PTR:
        std::cout << "value_ptr: " << std::dec << asIndex();
        return;

    case PROD_PTR:
        std::cout << "prod_ptr: " << std::dec << asIndex();
        return;

    case ASSIGN_PTR:
        std::cout << "assign_ptr: " << std::dec << (uint16_t)asAssignmentIndex() << " " << asIndex();
        return;

    case THIS:
        std::cout << "this";
        return;

    case VIEW:
        std::cout << "view";
        return;

    case MKS:
        std::cout << "mks";
        return;

    case VWS:
        std::cout << "vws";
        return;

    case NODE:
        std::cout << "nid: " << std::dec << (uint32_t)getNodeID();
        return;

    case DEVICE:
        std::cout << "did: " << std::dec << (uint32_t)getNodeID() << " " << (uint32_t)getClassID() << " " << (uint32_t)getDeviceID();
        return;

    case DEVICE_FUNCTION:
        std::cout << "fid: " << std::dec << asOpcode();
        return;

    case C_PTR:
        std::cout << "cptr: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case SET:
        std::cout << "set: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case OBJECT:
        std::cout << "obj: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case S_SET:
        std::cout << "s_set: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case MARKER:
        std::cout << "mk: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case OPERATOR:
        std::cout << "op: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case STRING:
        std::cout << "st: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = String_data = getAtomCount();
        Char_count = (atom & 0x000000FF);
        return;

    case TIMESTAMP:
        std::cout << "us";
        Members_to_go = Timestamp_data = 2;
        return;

    case GROUP:
        std::cout << "grp: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case INSTANTIATED_PROGRAM:
    case INSTANTIATED_ANTI_PROGRAM:
    case INSTANTIATED_INPUT_LESS_PROGRAM:
        std::cout << "ipgm: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case COMPOSITE_STATE:
        std::cout << "cst: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case MODEL:
        std::cout << "mdl: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case NULL_PROGRAM:
        std::cout << "null pgm " << (takesPastInputs() ? "all inputs" : "new inputs");
        return;

    default:
        if (Timestamp_data) {
            --Timestamp_data;
            std::cout << atom;
        } else if (String_data) {
            --String_data;
            std::string s;
            char *content = (char *)&atom;

            for (uint8_t i = 0; i < 4; ++i) {
                if (Char_count-- > 0) {
                    s += content[i];
                } else {
                    break;
                }
            }

            std::cout << s.c_str();
        } else if (isFloat()) {
            std::cout << "nb: " << std::dec << asFloat();
            return;
        } else {
            std::cout << "undef";
        }

        return;
    }
}